

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# si_function.hpp
# Opt level: O2

vector __thiscall
sisl::si_function<sisl::body_centered_cubic<char>,_sisl::bcc_linear_rdo,_3>::grad
          (si_function<sisl::body_centered_cubic<char>,_sisl::bcc_linear_rdo,_3> *this,vector *p)

{
  Index *pIVar1;
  bool bVar2;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDX;
  Index extraout_RDX;
  vector vVar3;
  void *local_40 [2];
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_30;
  
  if ((char)p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      '\x01') {
    bVar2 = basis_function::has_derivative();
    if (bVar2) {
      pIVar1 = &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      ;
      if (*(char *)((long)&p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows + 1) == '\0') {
        local_30 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pIVar1,in_RDX);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_40,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)&local_30);
        basis_function::grad_convolution_sum<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
                  ((basis_function *)this,(vector *)local_40,
                   (body_centered_cubic<char> *)
                   (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows);
      }
      else {
        local_30 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                             ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pIVar1,in_RDX);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_40,
                   (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                    *)&local_30);
        basis_function::
        grad_convolution_sum_h<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
                  ((basis_function *)this,(vector *)local_40,
                   (body_centered_cubic<char> *)
                   (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_rows,(double *)(p + 3));
      }
      goto LAB_001529e2;
    }
  }
  pIVar1 = &p[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (*(char *)((long)&p[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                       .m_rows + 1) == '\0') {
    local_30 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pIVar1,in_RDX);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_40,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_30);
    basis_function::grad_convolution_sum<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
              ((basis_function *)this,(vector *)local_40,
               (body_centered_cubic<char> *)
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               (body_centered_cubic<char> **)(p + 1));
  }
  else {
    local_30 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pIVar1,in_RDX);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_40,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_30);
    basis_function::grad_convolution_sum_h<3,sisl::body_centered_cubic<char>,sisl::bcc_linear_rdo>
              ((basis_function *)this,(vector *)local_40,
               (body_centered_cubic<char> *)
               (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows,
               (body_centered_cubic<char> **)(p + 1),(double *)(p + 3));
  }
LAB_001529e2:
  free(local_40[0]);
  vVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  vVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (vector)vVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual const vector grad(const vector &p) const {
            if(_bUseBasisDerivative && BF::has_derivative()) {
                if(!_bForceScale)
                    return BF::template grad_convolution_sum<N, L, BF>(
                            _mSpaceTransform*p,
                            (const L*)_lattice);
                return BF::template grad_convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        _dBasisScale);

            }
            if(!_bForceScale)
                return BF::template grad_convolution_sum<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        (const L**)_d);
            return BF::template grad_convolution_sum_h<N, L, BF>(
                        _mSpaceTransform*p,
                        (const L*)_lattice,
                        (const L**)_d,
                        _dBasisScale);

        }